

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::MultiVertexArrayTestGroup::init
          (MultiVertexArrayTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  MultiVertexArrayTestGroup *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiVertexArrayCountTests::MultiVertexArrayCountTests
            ((MultiVertexArrayCountTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiVertexArrayStorageTests::MultiVertexArrayStorageTests
            ((MultiVertexArrayStorageTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiVertexArrayStrideTests::MultiVertexArrayStrideTests
            ((MultiVertexArrayStrideTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiVertexArrayOutputTests::MultiVertexArrayOutputTests
            ((MultiVertexArrayOutputTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void MultiVertexArrayTestGroup::init (void)
{
	addChild(new MultiVertexArrayCountTests(m_context));
	addChild(new MultiVertexArrayStorageTests(m_context));
	addChild(new MultiVertexArrayStrideTests(m_context));
	addChild(new MultiVertexArrayOutputTests(m_context));
}